

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

bool __thiscall
NumberTemp::IsTempPropertyTransferStore(NumberTemp *this,Instr *instr,BackwardPass *backwardPass)

{
  Opnd *this_00;
  ThreadContextInfo *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  uint uVar5;
  SymID i;
  int iVar6;
  undefined4 *puVar7;
  SymOpnd *pSVar8;
  PropertySym *propertySym;
  NumberTemp *this_01;
  
  bVar3 = DoMarkTempNumbersOnTempObjects(this,backwardPass);
  if (bVar3) {
    uVar5 = instr->m_opcode - 0x70;
    if ((uVar5 < 0xb) && ((0x441U >> (uVar5 & 0x1f) & 1) != 0)) {
      this_00 = instr->m_dst;
      bVar3 = IR::Opnd::IsSymOpnd(this_00);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                           ,0x2d4,"(dst->IsSymOpnd())","dst->IsSymOpnd()");
        if (!bVar3) {
LAB_005bdbff:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      if ((this_00->field_0xb & 0x10) != 0) {
        pSVar8 = IR::Opnd::AsSymOpnd(this_00);
        this_01 = (NumberTemp *)pSVar8->m_sym;
        propertySym = Sym::AsPropertySym((Sym *)this_01);
        i = GetRepresentativePropertySymId(this_01,propertySym,backwardPass);
        BVar4 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((BVSparse<Memory::JitArenaAllocator> *)this,i);
        if (BVar4 == '\0') {
          pTVar1 = instr->m_func->m_threadContextInfo;
          iVar6 = (*pTVar1->_vptr_ThreadContextInfo[10])
                            (pTVar1,(ulong)(uint)propertySym->m_propertyId);
          return (bool)((byte)iVar6 ^ 1);
        }
      }
    }
    else if ((instr->m_dst != (Opnd *)0x0) && ((instr->m_dst->field_0xb & 0x10) != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                         ,0x2e5,"(instr->GetDst() == nullptr || !instr->GetDst()->CanStoreTemp())",
                         "instr->GetDst() == nullptr || !instr->GetDst()->CanStoreTemp()");
      if (!bVar3) goto LAB_005bdbff;
      *puVar7 = 0;
    }
  }
  return false;
}

Assistant:

bool
NumberTemp::IsTempPropertyTransferStore(IR::Instr * instr, BackwardPass * backwardPass)
{
    if (DoMarkTempNumbersOnTempObjects(backwardPass))
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::InitFld:
        case Js::OpCode::StFld:
        case Js::OpCode::StFldStrict:
            {
                IR::Opnd * dst = instr->GetDst();
                Assert(dst->IsSymOpnd());
                if (!dst->CanStoreTemp())
                {
                    return false;
                }
                // We don't mark temp store of numeric properties (e.g. object literal { 86: foo });
                // This should only happen for InitFld, as StFld should have changed to StElem
                PropertySym *propertySym = dst->AsSymOpnd()->m_sym->AsPropertySym();
                SymID propertySymId = this->GetRepresentativePropertySymId(propertySym, backwardPass);
                return !this->nonTempSyms.Test(propertySymId) &&
                    !instr->m_func->GetThreadContextInfo()->IsNumericProperty(propertySym->m_propertyId);
            }
        };

        // All other opcode shouldn't have sym opnd that can store temp, see ObjectTemp::IsTempUseOpCodeSym.
        // We also never mark the dst indir as can store temp for StElemI_A because we don't know what property
        // it is storing in (or it could be an array index).
        Assert(instr->GetDst() == nullptr || !instr->GetDst()->CanStoreTemp());
    }
    return false;
}